

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network.cpp
# Opt level: O2

CurveNetworkNodeVectorQuantity * __thiscall
polyscope::CurveNetwork::addNodeVectorQuantityImpl
          (CurveNetwork *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *vectors,VectorType vectorType)

{
  CurveNetworkNodeVectorQuantity *this_00;
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  local_80;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)name);
  QuantityStructure<polyscope::CurveNetwork>::checkForQuantityWithNameAndDeleteOrError
            (&this->super_QuantityStructure<polyscope::CurveNetwork>,&local_48,true);
  std::__cxx11::string::~string((string *)&local_48);
  this_00 = (CurveNetworkNodeVectorQuantity *)operator_new(0x3a8);
  std::__cxx11::string::string((string *)&local_68,(string *)name);
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector((vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
            *)&local_80,vectors);
  CurveNetworkNodeVectorQuantity::CurveNetworkNodeVectorQuantity
            (this_00,&local_68,
             (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
              *)&local_80,this,vectorType);
  std::
  _Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::~_Vector_base(&local_80);
  std::__cxx11::string::~string((string *)&local_68);
  QuantityStructure<polyscope::CurveNetwork>::addQuantity
            (&this->super_QuantityStructure<polyscope::CurveNetwork>,(QuantityType *)this_00,true);
  return this_00;
}

Assistant:

CurveNetworkNodeVectorQuantity* CurveNetwork::addNodeVectorQuantityImpl(std::string name,
                                                                        const std::vector<glm::vec3>& vectors,
                                                                        VectorType vectorType) {
  checkForQuantityWithNameAndDeleteOrError(name);
  CurveNetworkNodeVectorQuantity* q = new CurveNetworkNodeVectorQuantity(name, vectors, *this, vectorType);
  addQuantity(q);
  return q;
}